

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_type(FILE *out,Type *type,char should_print_struct_union)

{
  Type *pTVar1;
  long lVar2;
  size_t __size;
  char *pcVar3;
  bool bVar4;
  
  bVar4 = should_print_struct_union == '\0';
LAB_00144fce:
  do {
    print_type_qualifier(out,type);
    switch(((Type_Function *)type)->specifier) {
    case TS_VOID:
      pcVar3 = "void";
LAB_00145148:
      __size = 4;
LAB_0014514d:
      fwrite(pcVar3,__size,1,(FILE *)out);
      return;
    case TS_CHAR:
      pcVar3 = "char";
      goto LAB_00145148;
    case TS_INT:
      pcVar3 = "int";
      __size = 3;
      goto LAB_0014514d;
    case TS_FLOAT:
      pcVar3 = "float";
      __size = 5;
      goto LAB_0014514d;
    case TS_DOUBLE:
      pcVar3 = "double";
      goto LAB_0014512c;
    case TS_STRUCT:
    case TS_UNION:
      if (!bVar4) {
        print_struct_union(out,(Struct_Union *)((Type_Function *)type)->return_type);
        return;
      }
      pcVar3 = "union";
      if (((Type_Function *)type)->specifier == TS_STRUCT) {
        pcVar3 = "struct";
      }
      fprintf((FILE *)out,pcVar3);
      return;
    case TS_ENUM:
      pTVar1 = ((Type_Function *)type)->return_type;
      fwrite("enum ",5,1,(FILE *)out);
      print_list_of_denoted(out,(Queue *)pTVar1->node);
      return;
    case TS_POINTER:
      fwrite("pointer to ",0xb,1,(FILE *)out);
      type = (Type *)((Type_Function *)type)->number_of_arguments;
      bVar4 = true;
      goto LAB_00144fce;
    case TS_ARRAY:
      fprintf((FILE *)out,"array [%zu] of ",((Type_Function *)type)->number_of_arguments);
      lVar2 = 0x20;
      break;
    case TS_FUNC:
      fwrite("function taking arguments (",0x1b,1,(FILE *)out);
      print_function_args(out,(Type_Function *)type);
      fwrite(") returning ",0xc,1,(FILE *)out);
      lVar2 = 0x10;
      break;
    case TS_BITFIELD:
      fprintf((FILE *)out,"%zu bits of ",((Type_Function *)type)->return_type);
      lVar2 = 0x18;
      break;
    case TS_NONE:
      pcVar3 = "NONE";
      goto LAB_00145148;
    case TS_ERROR:
      pcVar3 = "ERROR!";
LAB_0014512c:
      __size = 6;
      goto LAB_0014514d;
    default:
      __assert_fail("!\"reached end of switch\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/backend/print/print.c"
                    ,0x1b1,"void print_type(FILE *, struct Type *, char)");
    }
    type = *(Type **)((long)&((Type_Function *)type)->specifier + lVar2);
  } while( true );
}

Assistant:

void print_type(FILE *out,struct Type *type,char should_print_struct_union)
{
	print_type_qualifier(out,type);
	switch(type->specifier)
	{
		case TS_VOID:
			fprintf(out,"void");return;
		case TS_CHAR:
			fprintf(out,"char");return;
		case TS_INT:
			fprintf(out,"int");return;
		case TS_FLOAT:
			fprintf(out,"float");return;
		case TS_DOUBLE:
			fprintf(out,"double");return;
		case TS_UNION:
		case TS_STRUCT:
			if(should_print_struct_union)
			{
				print_struct_union(out,((struct Type_Struct_Union*)type)->struct_union);
			}else
			{
				fprintf(out,(type->specifier==TS_STRUCT?"struct":"union"));
			}
			return;
		case TS_ENUM:
			print_enumeration(out,((struct Type_Enum*)type)->enumeration);
			return;
		case TS_POINTER:
			fprintf(out,"pointer to ");
			print_type(out,((struct Type_Pointer*)type)->points_to,0);
			return;
		case TS_ARRAY:
			fprintf(out,"array [%zu] of ",((struct Type_Array*)type)->number_of_elements);
			print_type(out,((struct Type_Array*)type)->is_array_of,should_print_struct_union);
			return;
		case TS_FUNC:
			fprintf(out,"function taking arguments (");
			print_function_args(out,(struct Type_Function*)type);
			fprintf(out,") returning ");
			print_type(out,((struct Type_Function*)type)->return_type,should_print_struct_union);
			return;
		case TS_BITFIELD:
			fprintf(out,"%zu bits of ",((struct Type_Bit_Field*)type)->number_of_bits);
			print_type(out,((struct Type_Bit_Field*)type)->base,should_print_struct_union);
			return;
		case TS_NONE:
			fprintf(out,"NONE");return;
		case TS_ERROR:
			fprintf(out,"ERROR!");return;

	}
	assert(!"reached end of switch");
}